

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmac.cpp
# Opt level: O3

void VHASH_PADDED_64(void *key,int len,uint64_t seed,void *res)

{
  uint64_t uVar1;
  uint64_t *extraout_RDX;
  uint uVar2;
  uint uVar3;
  uchar lastBlock [144];
  uchar auStack_c8 [152];
  
  uVar3 = len & 0xf;
  if (uVar3 != 0) {
    uVar2 = len;
    if (len < 0) {
      uVar2 = len + 0x7fU;
    }
    if (0xfe < len + 0x7fU) {
      vhash_update((uchar *)key,uVar2 & 0xffffff80,&vhi.ctx);
    }
    len = len % 0x80;
    memcpy(auStack_c8,(void *)((long)key + (long)(int)(uVar2 & 0xffffff80)),(long)len);
    memset(auStack_c8 + len,0,(ulong)(0x10 - uVar3));
    seed = (uint64_t)extraout_RDX;
    key = auStack_c8;
  }
  uVar1 = vhash((uchar *)key,len,(uint64_t *)seed,&vhi.ctx);
  *(uint64_t *)res = uVar1;
  return;
}

Assistant:

void VHASH_PADDED_64( const void * key, int len, uint64_t seed, void * res )
{
	(void) seed; //unused
	if (len & 0xF)
	{
		int blcCnt = len / VMAC_NHBYTES;
		int alignedLn = blcCnt * VMAC_NHBYTES;

		if (alignedLn) 
			vhash_update((unsigned char*)key, alignedLn, &(vhi.ctx));

		ALIGN(16) unsigned char lastBlock[VMAC_NHBYTES + 16];
		int bytesRemaining = len - alignedLn;
		memcpy(lastBlock, (unsigned char*)key + alignedLn, bytesRemaining);
		int bytesRemaining16aligned = ( ( bytesRemaining >> 4) << 4 ) + 16;
		memset(lastBlock + bytesRemaining, 0, bytesRemaining16aligned - bytesRemaining );

		uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
		*(uint64_t*)res = vhash((unsigned char *)lastBlock, bytesRemaining, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
		*(uint64_t*)res = vhash((unsigned char *)lastBlock, bytesRemaining, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
	}
	else // size is a multiple of 16
	{
		uint64_t tagl;
#if (VMAC_TAG_LEN == 128)
		*(uint64_t*)res = vhash((unsigned char *)lastBlock, bytesRemaining + 1, &tagl, &(vhi.ctx));
#elif (VMAC_TAG_LEN == 64)
		*(uint64_t*)res = vhash((unsigned char *)key, len, &tagl, &(vhi.ctx));
#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
	}
//	vhash_abort(&(vhi.ctx));
}